

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BitMap.cpp
# Opt level: O1

bool axl::sl::BitMap::isEqualImpl(size_t *p1,size_t count1,size_t *p2,size_t count2)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  iVar2 = bcmp(p1,p2,count1 * 8);
  if (iVar2 == 0) {
    bVar4 = count2 <= count1;
    if ((!bVar4) && (p2[count1] == 0)) {
      uVar1 = count1 + 1;
      do {
        uVar3 = uVar1;
        if (count2 == uVar3) break;
        uVar1 = uVar3 + 1;
      } while (p2[uVar3] == 0);
      bVar4 = count2 <= uVar3;
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool
BitMap::isEqualImpl(
	const size_t* p1,
	size_t count1,
	const size_t* p2,
 	size_t count2
) {
	ASSERT(count1 < count2);

	if (memcmp(p1, p2, count1 * sizeof(size_t)))
		return false;

	for (size_t i = count1; i < count2; i++)
		if (p2[i])
			return false;

	return true;
}